

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O0

real_t __thiscall
xLearn::FFMScore::CalcScore(FFMScore *this,SparseRow *row,Model *model,real_t norm)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  index_t iVar9;
  pointer pNVar10;
  Model *in_RDX;
  float in_XMM0_Da;
  double dVar11;
  undefined1 auVar12 [64];
  real_t sum_v;
  __m128 XMMw2;
  __m128 XMMw1;
  index_t d;
  __m128 XMMv;
  real_t *w2_base;
  real_t *w1_base;
  real_t v2;
  index_t f2;
  index_t j2;
  const_iterator iter_j;
  real_t v1;
  index_t f1;
  index_t j1;
  const_iterator iter_i;
  __m128 XMMt;
  int align;
  index_t align1;
  index_t align0;
  index_t feat_id;
  const_iterator iter;
  index_t aux_size;
  index_t num_field;
  index_t num_feat;
  real_t *w;
  real_t sqrt_norm;
  real_t sum_w;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  int iVar13;
  undefined4 in_stack_fffffffffffffe04;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  *in_stack_fffffffffffffe08;
  uint local_1cc;
  undefined8 uStack_1c0;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_190;
  real_t local_184;
  uint local_180;
  uint local_17c;
  Node *local_178;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_170;
  undefined1 local_168 [16];
  int local_158;
  int local_154;
  uint local_150;
  uint local_14c;
  Node *local_148;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_140;
  int local_134;
  index_t local_130;
  index_t local_12c;
  real_t *local_128;
  uint local_11c;
  float local_118;
  float local_114;
  Model *local_110;
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_cc;
  real_t *local_c8;
  real_t *local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_18;
  undefined1 extraout_var [60];
  
  local_118 = 0.0;
  local_114 = in_XMM0_Da;
  local_110 = in_RDX;
  dVar11 = std::sqrt((double)(ulong)(uint)in_XMM0_Da);
  local_11c = SUB84(dVar11,0);
  local_128 = Model::GetParameter_w(local_110);
  local_12c = Model::GetNumFeature(local_110);
  local_130 = Model::GetNumField(local_110);
  auVar12._0_4_ = Model::GetAuxiliarySize(local_110);
  auVar12._4_60_ = extraout_var;
  local_134 = vcvttss2usi_avx512f(auVar12._0_16_);
  local_140._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffffdf8);
  while( true ) {
    local_148 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  (in_stack_fffffffffffffdf8);
    bVar8 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)in_stack_fffffffffffffdf8);
    if (!bVar8) break;
    pNVar10 = __gnu_cxx::
              __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
              ::operator->(&local_140);
    local_14c = pNVar10->feat_id;
    if (local_14c < local_12c) {
      pNVar10 = __gnu_cxx::
                __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                ::operator->(&local_140);
      auVar4 = vfmadd213ss_fma(ZEXT416(local_11c),
                               ZEXT416((uint)(pNVar10->feat_val * local_128[local_14c * local_134]))
                               ,ZEXT416((uint)local_118));
      local_118 = auVar4._0_4_;
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_140);
  }
  local_128 = Model::GetParameter_b(local_110);
  local_118 = local_118 + *local_128;
  iVar13 = local_134;
  iVar9 = Model::get_aligned_k((Model *)0x1b4f13);
  local_150 = iVar13 * iVar9;
  local_154 = local_130 * local_150;
  local_158 = local_134 << 2;
  local_128 = Model::GetParameter_v(local_110);
  local_f8 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_170._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffffdf8);
  while( true ) {
    local_178 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  (in_stack_fffffffffffffdf8);
    bVar8 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe04,iVar13),
                       (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                        *)in_stack_fffffffffffffdf8);
    if (!bVar8) break;
    pNVar10 = __gnu_cxx::
              __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
              ::operator->(&local_170);
    local_17c = pNVar10->feat_id;
    pNVar10 = __gnu_cxx::
              __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
              ::operator->(&local_170);
    local_180 = pNVar10->field_id;
    if ((local_17c < local_12c) && (local_180 < local_130)) {
      pNVar10 = __gnu_cxx::
                __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                ::operator->(&local_170);
      local_184 = pNVar10->feat_val;
      local_190 = __gnu_cxx::
                  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                  ::operator+(in_stack_fffffffffffffe08,CONCAT44(in_stack_fffffffffffffe04,iVar13));
      while( true ) {
        std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end(in_stack_fffffffffffffdf8);
        bVar8 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe04,iVar13),
                           (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                            *)in_stack_fffffffffffffdf8);
        if (!bVar8) break;
        pNVar10 = __gnu_cxx::
                  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                  ::operator->(&local_190);
        uVar2 = pNVar10->feat_id;
        pNVar10 = __gnu_cxx::
                  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                  ::operator->(&local_190);
        uVar3 = pNVar10->field_id;
        if ((uVar2 < local_12c) && (uVar3 < local_130)) {
          pNVar10 = __gnu_cxx::
                    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                    ::operator->(&local_190);
          local_e8 = local_184 * pNVar10->feat_val * local_114;
          auVar4._8_4_ = local_e8;
          auVar4._0_8_ = CONCAT44(local_e8,local_e8);
          auVar4._12_4_ = local_e8;
          for (local_1cc = 0; fStack_e4 = local_e8, fStack_e0 = local_e8, fStack_dc = local_e8,
              local_cc = local_e8, local_1cc < local_150; local_1cc = local_158 + local_1cc) {
            local_c0 = local_128 +
                       (ulong)(local_17c * local_154) +
                       (ulong)(uVar3 * local_150) + (ulong)local_1cc;
            uVar5 = *(undefined8 *)local_c0;
            uVar6 = *(undefined8 *)(local_c0 + 2);
            local_c8 = local_128 +
                       (ulong)(uVar2 * local_154) +
                       (ulong)(local_180 * local_150) + (ulong)local_1cc;
            in_stack_fffffffffffffe08 =
                 *(__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                   **)local_c8;
            uVar7 = *(undefined8 *)(local_c8 + 2);
            auVar1 = local_168;
            local_68._0_4_ = (float)uVar5;
            local_68._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_60._0_4_ = (float)uVar6;
            uStack_60._4_4_ = (float)((ulong)uVar6 >> 0x20);
            local_78._0_4_ = SUB84(in_stack_fffffffffffffe08,0);
            local_78._4_4_ = (float)((ulong)in_stack_fffffffffffffe08 >> 0x20);
            uStack_70._0_4_ = (float)uVar7;
            uStack_70._4_4_ = (float)((ulong)uVar7 >> 0x20);
            local_88._0_4_ = (float)local_68 * (float)local_78;
            local_88._4_4_ = local_68._4_4_ * local_78._4_4_;
            local_88._8_4_ = (float)uStack_60 * (float)uStack_70;
            local_88._12_4_ = uStack_60._4_4_ * uStack_70._4_4_;
            uStack_1c0 = auVar4._8_8_;
            uStack_90 = uStack_1c0;
            local_b8 = local_88._0_4_ * local_e8;
            fStack_b4 = local_88._4_4_ * local_e8;
            fStack_b0 = local_88._8_4_ * local_e8;
            fStack_ac = local_88._12_4_ * local_e8;
            local_a8._0_4_ = local_168._0_4_;
            local_a8._4_4_ = local_168._4_4_;
            fStack_a0 = local_168._8_4_;
            fStack_9c = local_168._12_4_;
            local_168._0_4_ = (float)local_a8._0_4_ + local_b8;
            local_168._4_4_ = (float)local_a8._4_4_ + fStack_b4;
            local_168._8_4_ = fStack_a0 + fStack_b0;
            local_168._12_4_ = fStack_9c + fStack_ac;
            _local_a8 = auVar1;
            local_98 = CONCAT44(local_e8,local_e8);
            local_78 = in_stack_fffffffffffffe08;
            uStack_70 = uVar7;
            local_68 = uVar5;
            uStack_60 = uVar6;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
        ::operator++(&local_190);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_170);
  }
  auVar4 = vhaddps_avx(local_168,local_168);
  auVar4 = vhaddps_avx(auVar4,auVar4);
  local_18 = auVar4._0_4_;
  return local_18 + local_118;
}

Assistant:

real_t FFMScore::CalcScore(const SparseRow* row,
                           Model& model,
                           real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sum_w = 0;
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  index_t aux_size = model.GetAuxiliarySize();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    sum_w += (iter->feat_val * w[feat_id*aux_size] * sqrt_norm);
  }
  // bias
  w = model.GetParameter_b();
  sum_w += w[0];
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = aux_size * model.get_aligned_k();
  index_t align1 = num_field * align0;
  int align = kAlign * aux_size;
  w = model.GetParameter_v();
  __m128 XMMt = _mm_setzero_ps();
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature in Prediction
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature in Prediction
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      for (index_t d = 0; d < align0; d += align) {
        __m128 XMMw1 = _mm_load_ps(w1_base + d);
        __m128 XMMw2 = _mm_load_ps(w2_base + d);
        XMMt = _mm_add_ps(XMMt,
               _mm_mul_ps(
               _mm_mul_ps(XMMw1, XMMw2), XMMv));
      }
    }
  }
  real_t sum_v = 0;
  XMMt = _mm_hadd_ps(XMMt, XMMt);
  XMMt = _mm_hadd_ps(XMMt, XMMt);
  _mm_store_ss(&sum_v, XMMt);

  return sum_v + sum_w;
}